

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

string * __thiscall
sensors_analytics::Sdk::GetCookie_abi_cxx11_(string *__return_storage_ptr__,Sdk *this,bool decode)

{
  long lVar1;
  string cookie;
  string local_38;
  
  if (instance_ == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar1 = **(long **)(instance_ + 0x68);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,lVar1,(*(long **)(instance_ + 0x68))[1] + lVar1);
    if ((char)this == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
                 local_38._M_dataplus._M_p + local_38._M_string_length);
    }
    else {
      utils::UrlDecode(__return_storage_ptr__,&local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Sdk::GetCookie(bool decode) {
    if (instance_) {
        string cookie = instance_->consumer_->request_header_cookie;
        string decodeCookie = decode ? utils::UrlDecode(cookie) : cookie;
        return decodeCookie;
    }
    return "";
}